

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_NetworkIdentifyUnset_Test::TestBody
          (InterpreterTestSuite_PC_NetworkIdentifyUnset_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  Registry *pRVar6;
  Status SVar7;
  bool bVar8;
  char *pcVar9;
  char *pcVar10;
  Status local_49a;
  Status local_499;
  string local_498;
  undefined1 local_470 [8];
  _Alloc_hider local_468;
  long local_460;
  char local_458 [16];
  _Alloc_hider local_448;
  char local_438 [16];
  internal local_428 [8];
  pointer local_420;
  string local_418;
  string local_3f8;
  Value value;
  string local_390;
  State local_370;
  State local_36c;
  ByteArray local_368;
  ByteArray local_348;
  char *local_330;
  string local_328;
  string local_308;
  UnixTime local_2e8;
  UnixTime local_2e0;
  Network nwk;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  value.mError.mCode = kNone;
  value.mError._4_4_ = 0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&nwk,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&value);
  _Var5 = nwk.mName._M_dataplus;
  if ((char)nwk.mId.mId == '\0') {
    testing::Message::Message((Message *)&value);
    if (nwk.mName._M_dataplus._M_p == (pointer)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)nwk.mName._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_470,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x672,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_470,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_470);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
    if (nwk.mName._M_dataplus._M_p == (pointer)0x0) goto LAB_0017bc3b;
    if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
      operator_delete(*nwk.mName._M_dataplus._M_p);
    }
  }
  else {
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var5._M_p);
    }
    pRVar6 = ctx.mRegistry;
    value.mError._0_8_ = &value.mError.mMessage._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.1","");
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_470 = (undefined1  [8])&local_460;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_36c,0,0,0,0,0);
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"net1","");
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"");
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"");
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"domain1","");
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    pcVar9 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"","");
    ot::commissioner::UnixTime::UnixTime(&local_2e0,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&nwk,(string *)&value,0x4e21,&local_348,(string *)local_470,local_36c,
               &local_498,1,&local_3f8,&local_418,(Timestamp)0x0,0,&local_390,&local_368,&local_308,
               '\0',0,&local_328,local_2e0,0x103f);
    local_499 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&nwk);
    local_49a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (local_428,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_499,&local_49a);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&nwk);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p);
    }
    if (local_470 != (undefined1  [8])&local_460) {
      operator_delete((void *)local_470);
    }
    if (local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
      operator_delete((void *)value.mError._0_8_);
    }
    pcVar4 = local_420;
    if (local_428[0] == (internal)0x0) {
      testing::Message::Message((Message *)&nwk);
      if (local_420 != (pointer)0x0) {
        pcVar9 = *(char **)local_420;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x676,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if ((long *)CONCAT71(nwk._1_7_,(char)nwk.mId.mId) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(nwk._1_7_,(char)nwk.mId.mId) + 8))();
      }
      if (local_420 == (pointer)0x0) goto LAB_0017bc3b;
      nwk.mName._M_dataplus._M_p = local_420;
      if (*(pointer *)local_420 != local_420 + 0x10) {
        operator_delete(*(pointer *)local_420);
      }
    }
    else {
      if (local_420 != (pointer)0x0) {
        if (*(pointer *)local_420 != local_420 + 0x10) {
          operator_delete(*(pointer *)local_420);
        }
        operator_delete(pcVar4);
      }
      pRVar6 = ctx.mRegistry;
      value.mError._0_8_ = &value.mError.mMessage._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.2","");
      local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_470 = (undefined1  [8])&local_460;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"1.1","");
      ot::commissioner::BorderAgent::State::State(&local_370,0,0,0,0,0);
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"net2","");
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"");
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"");
      local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      local_330 = "";
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328);
      ot::commissioner::UnixTime::UnixTime(&local_2e8,0);
      pcVar9 = (char *)(ulong)(uint)local_370;
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&nwk,(string *)&value,0x4e22,&local_348,(string *)local_470,
                 local_370,&local_498,2,&local_3f8,&local_418,(Timestamp)0x0,0,&local_390,&local_368
                 ,&local_308,'\0',0,&local_328,local_2e8,0x3f);
      local_499 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&nwk);
      local_49a = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                (local_428,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x3F})"
                 ,"RegistryStatus::kSuccess",&local_499,&local_49a);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&nwk);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p);
      }
      if (local_470 != (undefined1  [8])&local_460) {
        operator_delete((void *)local_470);
      }
      if (local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
        operator_delete((void *)value.mError._0_8_);
      }
      if (local_428[0] == (internal)0x0) {
        testing::Message::Message((Message *)&nwk);
        if (local_420 != (pointer)0x0) {
          local_330 = *(char **)local_420;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x67a,local_330);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if ((long *)CONCAT71(nwk._1_7_,(char)nwk.mId.mId) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(nwk._1_7_,(char)nwk.mId.mId) + 8))();
        }
        if (local_420 == (pointer)0x0) goto LAB_0017bc3b;
        nwk.mName._M_dataplus._M_p = local_420;
        if (*(pointer *)local_420 != local_420 + 0x10) {
          operator_delete(*(pointer *)local_420);
        }
      }
      else {
        if (local_420 != (pointer)0x0) {
          if (*(pointer *)local_420 != local_420 + 0x10) {
            operator_delete(*(pointer *)local_420);
          }
          operator_delete(local_420);
        }
        ot::commissioner::persistent_storage::Network::Network(&nwk);
        SVar7 = ot::commissioner::persistent_storage::Registry::GetCurrentNetwork
                          (ctx.mRegistry,&nwk);
        local_470[0] = SVar7;
        local_498._M_dataplus._M_p = local_498._M_dataplus._M_p & 0xffffffffffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&value,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                   "RegistryStatus::kSuccess",local_470,(Status *)&local_498);
        if ((undefined1)value.mError.mCode == kNone) {
          testing::Message::Message((Message *)local_470);
          if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)value.mError.mMessage._M_dataplus._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_498,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x67d,pcVar10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_498,(Message *)local_470);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
          if (local_470 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_470 + 8))();
          }
        }
        _Var5._M_p = value.mError.mMessage._M_dataplus._M_p;
        if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
          if (*value.mError.mMessage._M_dataplus._M_p !=
              value.mError.mMessage._M_dataplus._M_p + 0x10) {
            operator_delete(*value.mError.mMessage._M_dataplus._M_p);
          }
          operator_delete(_Var5._M_p);
        }
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&value,"nwk.mId.mId","EMPTY_ID",(uint *)&nwk,
                   &ot::commissioner::persistent_storage::EMPTY_ID);
        if ((undefined1)value.mError.mCode == kNone) {
          testing::Message::Message((Message *)local_470);
          if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)value.mError.mMessage._M_dataplus._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_498,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x67e,pcVar10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_498,(Message *)local_470);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
          if (local_470 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_470 + 8))();
          }
        }
        if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
          if (*value.mError.mMessage._M_dataplus._M_p !=
              value.mError.mMessage._M_dataplus._M_p + 0x10) {
            operator_delete(*value.mError.mMessage._M_dataplus._M_p);
          }
          operator_delete(value.mError.mMessage._M_dataplus._M_p);
        }
        local_3f8.field_2._M_allocated_capacity = 0;
        local_3f8._M_dataplus._M_p = (pointer)0x0;
        local_3f8._M_string_length = 0;
        paVar1 = &value.mError.mMessage.field_2;
        value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
        value.mError.mMessage._M_string_length = 0;
        value.mError.mMessage.field_2._M_local_buf[0] = '\0';
        paVar2 = &value.mData.field_2;
        value.mData._M_string_length = 0;
        value.mData.field_2._M_local_buf[0] = '\0';
        local_470 = (undefined1  [8])&local_460;
        value.mError.mMessage._M_dataplus._M_p = (pointer)paVar1;
        value.mData._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Network identify","");
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&local_418,&ctx.mInterpreter,(string *)local_470);
        local_498.field_2._M_allocated_capacity = local_3f8.field_2._M_allocated_capacity;
        local_498._M_string_length = local_3f8._M_string_length;
        local_498._M_dataplus._M_p = local_3f8._M_dataplus._M_p;
        local_3f8.field_2._M_allocated_capacity = local_418.field_2._M_allocated_capacity;
        local_3f8._M_dataplus._M_p = local_418._M_dataplus._M_p;
        local_3f8._M_string_length = local_418._M_string_length;
        local_418._M_dataplus._M_p = (pointer)0x0;
        local_418._M_string_length = 0;
        local_418.field_2._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_498);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_418);
        if (local_470 != (undefined1  [8])&local_460) {
          operator_delete((void *)local_470);
        }
        ot::commissioner::Interpreter::Eval
                  ((Value *)local_470,&ctx.mInterpreter,(Expression *)&local_3f8);
        value.mError.mCode = local_470._0_4_;
        std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&local_468);
        std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_448);
        if (local_448._M_p != local_438) {
          operator_delete(local_448._M_p);
        }
        if (local_468._M_p != local_458) {
          operator_delete(local_468._M_p);
        }
        bVar8 = ot::commissioner::Interpreter::Value::HasNoError(&value);
        local_498._M_dataplus._M_p._0_1_ = bVar8;
        local_498._M_string_length = 0;
        if (!bVar8) {
          testing::Message::Message((Message *)&local_418);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_470,(internal *)&local_498,(AssertionResult *)0x2ddeee,"false",
                     "true",pcVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_390,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x685,(char *)local_470);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_390,(Message *)&local_418);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
          if (local_470 != (undefined1  [8])&local_460) {
            operator_delete((void *)local_470);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
          }
          sVar3 = local_498._M_string_length;
          if ((undefined8 *)local_498._M_string_length != (undefined8 *)0x0) {
            if (*(undefined8 **)local_498._M_string_length !=
                (undefined8 *)(local_498._M_string_length + 0x10)) {
              operator_delete(*(undefined8 **)local_498._M_string_length);
            }
            operator_delete((void *)sVar3);
          }
        }
        ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)local_470,&value);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_498,"\"none\"","value.ToString().c_str()","none",
                   (char *)local_470);
        if (local_470 != (undefined1  [8])&local_460) {
          operator_delete((void *)local_470);
        }
        if ((char)local_498._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)local_470);
          if ((undefined8 *)local_498._M_string_length == (undefined8 *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)local_498._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x686,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_418,(Message *)local_470);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_418);
          if (local_470 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_470 + 8))();
          }
        }
        sVar3 = local_498._M_string_length;
        if ((undefined8 *)local_498._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_498._M_string_length !=
              (undefined8 *)(local_498._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_498._M_string_length);
          }
          operator_delete((void *)sVar3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value.mData._M_dataplus._M_p != paVar2) {
          operator_delete(value.mData._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value.mError.mMessage._M_dataplus._M_p != paVar1) {
          operator_delete(value.mError.mMessage._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
          operator_delete(nwk.mMlp._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nwk.mName._M_dataplus._M_p == &nwk.mName.field_2) goto LAB_0017bc3b;
      }
    }
  }
  operator_delete(nwk.mName._M_dataplus._M_p);
LAB_0017bc3b:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_NetworkIdentifyUnset)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0,
                                             0x3F}),
              RegistryStatus::kSuccess);

    Network nwk;
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mId.mId, EMPTY_ID);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("Network identify");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    EXPECT_STREQ("none", value.ToString().c_str());
}